

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall
ExecutionEngine::populateMultiarray
          (ExecutionEngine *this,ArrayObject *array,ValueType valueType,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *count)

{
  int iVar1;
  Value value;
  Value value_00;
  reference pvVar2;
  size_type sVar3;
  anon_union_8_10_52016fac_for_data this_00;
  ValueType local_104;
  undefined4 local_d8;
  Value subarrayValue_1;
  ArrayObject *subarray;
  int i_1;
  Value subarrayValue;
  int i;
  ValueType arrayType;
  int currCount;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *count_local;
  ValueType valueType_local;
  ArrayObject *array_local;
  ExecutionEngine *this_local;
  
  pvVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(count);
  iVar1 = *pvVar2;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(count);
  sVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::size(count);
  local_104 = valueType;
  if (1 < sVar3) {
    local_104 = REFERENCE;
  }
  sVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::size(count);
  if (sVar3 == 0) {
    for (subarrayValue.data.longValue._4_4_ = 0; subarrayValue.data._4_4_ < iVar1;
        subarrayValue.data.longValue._4_4_ = subarrayValue.data.longValue._4_4_ + 1) {
      value_00.type = valueType;
      value_00.printType = valueType;
      value_00.data.longValue = 0;
      ArrayObject::pushValue(array,value_00);
    }
  }
  else {
    for (subarray._4_4_ = 0; subarray._4_4_ < iVar1; subarray._4_4_ = subarray._4_4_ + 1) {
      this_00.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)this_00.object,local_104);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::stack
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&subarrayValue_1.data,count);
      populateMultiarray(this,(ArrayObject *)this_00.object,valueType,
                         (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&subarrayValue_1.data
                        );
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&subarrayValue_1.data);
      value.type = 9;
      value.printType = local_d8;
      value.data.object = (Object *)this_00.longValue;
      subarrayValue_1._0_8_ = this_00.object;
      ArrayObject::pushValue(array,value);
    }
  }
  return;
}

Assistant:

void ExecutionEngine::populateMultiarray(ArrayObject *array, ValueType valueType, stack<int> count) {
    int currCount = count.top();
    count.pop();
    
    ValueType arrayType = (count.size() > 1) ? ValueType::REFERENCE : valueType;
    
    if (count.size() == 0) {
        for (int i = 0; i < currCount; i++) {
            Value subarrayValue;
            subarrayValue.type = valueType;
            subarrayValue.printType = valueType;
            subarrayValue.data.longValue = 0;
            array->pushValue(subarrayValue);
        }
    } else {
        for (int i = 0; i < currCount; i++) {
            ArrayObject *subarray = new ArrayObject(arrayType);
            populateMultiarray(subarray, valueType, count);
            
            Value subarrayValue;
            subarrayValue.type = ValueType::REFERENCE;
            subarrayValue.data.object = subarray;
            array->pushValue(subarrayValue);
        }
    }
}